

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void jmp_far(PDISASM pMyDisasm)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  bool bVar4;
  ulong local_28;
  size_t i;
  UInt64 MyAddress;
  UInt32 MyNumber;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).Architecture == 0x40) {
    failDecode(pMyDisasm);
  }
  else {
    (pMyDisasm->Instruction).Category = 0x10006;
    (pMyDisasm->Instruction).BranchType = 0xb;
    (pMyDisasm->Operand1).AccessMode = 1;
    bVar4 = (pMyDisasm->Reserved_).SYNTAX_ != 0x400;
    if (bVar4) {
      strcpy((pMyDisasm->Instruction).Mnemonic,"jmp far");
    }
    else {
      strcpy((pMyDisasm->Instruction).Mnemonic,"ljmp");
      strcpy((pMyDisasm->Operand1).OpMnemonic,"$");
    }
    local_28 = (ulong)!bVar4;
    if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
      iVar1 = Security(7,pMyDisasm);
      if (iVar1 == 0) {
        return;
      }
      MyAddress._4_4_ = (uint)*(ushort *)((pMyDisasm->Reserved_).EIP_ + 5);
      sVar3 = CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand1).OpMnemonic + local_28,"%.4X",
                                  (ulong)MyAddress._4_4_);
    }
    else {
      iVar1 = Security(5,pMyDisasm);
      if (iVar1 == 0) {
        return;
      }
      MyAddress._4_4_ = (uint)*(ushort *)((pMyDisasm->Reserved_).EIP_ + 3);
      sVar3 = CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand1).OpMnemonic + local_28,"%.4X",
                                  (ulong)MyAddress._4_4_);
    }
    local_28 = sVar3 + local_28;
    if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
      strcpy((pMyDisasm->Operand1).OpMnemonic + local_28," , $");
      local_28 = local_28 + 4;
    }
    else {
      strcpy((pMyDisasm->Operand1).OpMnemonic + local_28," :");
      local_28 = local_28 + 3;
    }
    uVar2 = MyAddress._4_4_ << 4;
    MyAddress._4_4_ = *(uint *)((pMyDisasm->Reserved_).EIP_ + 1);
    if ((pMyDisasm->Reserved_).OperandSize == 0x10) {
      MyAddress._4_4_ = MyAddress._4_4_ & 0xffff;
    }
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand1).OpMnemonic + local_28,"%.8X",
                        (ulong)MyAddress._4_4_);
    if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
      (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 7;
    }
    else {
      (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 5;
    }
    (pMyDisasm->Instruction).AddrValue = (ulong)uVar2 + (ulong)MyAddress._4_4_;
    FillFlags(pMyDisasm,0x33);
  }
  return;
}

Assistant:

void __bea_callspec__ jmp_far(PDISASM pMyDisasm)
{
    UInt32 MyNumber;
    UInt64 MyAddress;
    size_t i = 0;
    if (GV.Architecture == 64) {
        failDecode(pMyDisasm);
    }
    else {
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+CONTROL_TRANSFER;
        pMyDisasm->Instruction.BranchType = JmpType;
        pMyDisasm->Operand1.AccessMode = READ;
        if (GV.SYNTAX_ == ATSyntax) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "ljmp");
            #endif
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic,"\x24");
            #endif
            i++;
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "jmp far");
            #endif
        }
        if (GV.OperandSize ==32) {
            if (!Security(7, pMyDisasm)) return;
            MyNumber = *((UInt16*) (GV.EIP_+5));
            #ifndef BEA_LIGHT_DISASSEMBLY
               i += CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand1.OpMnemonic+i, "%.4X",(Int64) MyNumber);
            #endif
        }
        else {
            if (!Security(5, pMyDisasm)) return;
            MyNumber = *((UInt16*) (GV.EIP_+3));
            #ifndef BEA_LIGHT_DISASSEMBLY
               i += CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand1.OpMnemonic+i, "%.4X",(Int64) MyNumber);
            #endif
        }
        if (GV.SYNTAX_ == ATSyntax) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic+i, " , \x24");
            #endif
            i+=4;
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand1.OpMnemonic+i, " :");
            #endif
            i+=3;
        }
        MyAddress = MyNumber*16;
        MyNumber = *((UInt32*) (GV.EIP_+1));
        if (GV.OperandSize == 16) {
            MyNumber = MyNumber & 0xffff;
        }
        #ifndef BEA_LIGHT_DISASSEMBLY
           i += CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand1.OpMnemonic+i, "%.8X",(Int64) MyNumber);
        #endif
        if (GV.OperandSize == 32) {
            GV.EIP_+=7;
        }
        else {
            GV.EIP_+=5;
        }
        pMyDisasm->Instruction.AddrValue = MyAddress + MyNumber;
        FillFlags(pMyDisasm,51);
    }
}